

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall
NLReaderTest_ArithKind_Test::~NLReaderTest_ArithKind_Test(NLReaderTest_ArithKind_Test *this)

{
  void *in_RDI;
  
  ~NLReaderTest_ArithKind_Test((NLReaderTest_ArithKind_Test *)0x1a5168);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(NLReaderTest, ArithKind) {
  namespace arith = mp::arith;
  EXPECT_GE(arith::GetKind(), arith::UNKNOWN);
  EXPECT_LE(arith::GetKind(), arith::LAST);
  EXPECT_TRUE(arith::IsIEEE(arith::IEEE_LITTLE_ENDIAN));
  EXPECT_TRUE(arith::IsIEEE(arith::IEEE_BIG_ENDIAN));
  EXPECT_FALSE(arith::IsIEEE(arith::UNKNOWN));
  EXPECT_FALSE(arith::IsIEEE(arith::IBM));
  EXPECT_FALSE(arith::IsIEEE(arith::VAX));
  EXPECT_FALSE(arith::IsIEEE(arith::CRAY));
}